

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateStaticInitializer
          (FileGenerator *this,Printer *p)

{
  vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
  *this_00;
  Printer *pPVar1;
  long lVar2;
  allocator<char> local_226;
  allocator<char> local_225;
  int priority;
  Printer *p_local;
  undefined1 *local_218;
  undefined8 local_210;
  undefined1 local_208;
  undefined7 uStack_207;
  undefined8 uStack_200;
  FileGenerator *local_1f8;
  long local_1f0;
  _Any_data local_1e8;
  code *local_1d8;
  code *pcStack_1d0;
  string local_1c0;
  Sub local_1a0;
  undefined1 *local_e8;
  undefined8 local_e0;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined8 uStack_d0;
  variant<std::__cxx11::string,std::function<bool()>> local_c8 [32];
  char local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  
  priority = 0;
  p_local = p;
  local_1f8 = this;
  for (local_1f0 = 0x20; pPVar1 = p_local, local_1f0 != 0x50; local_1f0 = local_1f0 + 0x18) {
    priority = priority + 1;
    this_00 = (vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
               *)((long)local_1f8->static_initializers_ + local_1f0 + -0x20);
    if ((this_00->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_start !=
        (this_00->
        super__Vector_base<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,"priority",&local_225)
      ;
      io::Printer::Sub::Sub<int&>(&local_1a0,&local_1c0,&priority);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_218,"expr",&local_226);
      local_e0 = local_210;
      local_e8 = &local_d8;
      if (local_218 == &local_208) {
        uStack_d0 = uStack_200;
      }
      else {
        local_e8 = local_218;
      }
      _local_d8 = CONCAT71(uStack_207,local_208);
      local_210 = 0;
      local_208 = 0;
      local_1d8 = (code *)0x0;
      pcStack_1d0 = (code *)0x0;
      local_1e8._M_unused._M_object = (void *)0x0;
      local_1e8._8_8_ = 0;
      local_218 = &local_208;
      local_1e8._M_unused._M_object = operator_new(0x18);
      *(vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        **)local_1e8._M_unused._0_8_ = this_00;
      *(Printer ***)((long)local_1e8._M_unused._0_8_ + 8) = &p_local;
      *(code *)((long)local_1e8._M_unused._0_8_ + 0x10) = (code)0x0;
      pcStack_1d0 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                    ::_M_invoke;
      local_1d8 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/io/printer.h:931:7)>
                  ::_M_manager;
      std::variant<std::__cxx11::string,std::function<bool()>>::
      variant<std::function<bool()>,void,void,std::function<bool()>,void>
                (local_c8,(function<bool_()> *)&local_1e8);
      std::_Function_base::~_Function_base((_Function_base *)&local_1e8);
      local_a0 = local_90;
      local_98 = 0;
      local_90[0] = 0;
      local_80 = 0;
      if (local_a8 == '\x01') {
        std::__cxx11::string::assign((char *)&local_a0);
      }
      local_38 = 0;
      google::protobuf::io::Printer::Emit
                (pPVar1,&local_1a0,2,0xc0,
                 "\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type\n              _static_init$priority$_ PROTOBUF_UNUSED =\n                  ($expr$, ::std::false_type{});\n        "
                );
      lVar2 = 0xb8;
      do {
        io::Printer::Sub::~Sub((Sub *)((long)&local_1a0.key_._M_dataplus._M_p + lVar2));
        lVar2 = lVar2 + -0xb8;
      } while (lVar2 != -0xb8);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::
      vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
      ::clear(this_00);
    }
  }
  return;
}

Assistant:

void FileGenerator::GenerateStaticInitializer(io::Printer* p) {
  int priority = 0;
  for (auto& inits : static_initializers_) {
    ++priority;
    if (inits.empty()) continue;
    p->Emit(
        {{"priority", priority},
         {"expr",
          [&] {
            for (auto& init : inits) {
              init(p);
            }
          }}},
        R"cc(
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY$priority$ static ::std::false_type
              _static_init$priority$_ PROTOBUF_UNUSED =
                  ($expr$, ::std::false_type{});
        )cc");
    // Reset the vector because we might be generating many files.
    inits.clear();
  }
}